

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

void __thiscall
Lib::Set<Kernel::TermOrderingDiagram::Polynomial_*,_Lib::DerefPtrHash<Lib::DefaultHash>_>::Set
          (Set<Kernel::TermOrderingDiagram::Polynomial_*,_Lib::DerefPtrHash<Lib::DefaultHash>_>
           *this)

{
  this->_capacity = 0;
  this->_nonemptyCells = 0;
  this->_size = 0;
  this->_entries = (Cell *)0x0;
  expand(this);
  return;
}

Assistant:

Set()
    : _capacity(0),
      _nonemptyCells(0),
      _size(0),
      _entries(0)
  {
    expand();
  }